

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::GlobalOptions::GlobalOptions(GlobalOptions *this,Group *base,Base *options_)

{
  function<bool_(const_args::Group_&)> local_60;
  string local_40;
  Base *local_20;
  Base *options__local;
  Group *base_local;
  GlobalOptions *this_local;
  
  local_20 = options_;
  options__local = &base->super_Base;
  base_local = &this->super_Group;
  std::__cxx11::string::string((string *)&local_40);
  std::function<bool(args::Group_const&)>::function<bool(&)(args::Group_const&),void>
            ((function<bool(args::Group_const&)> *)&local_60,Group::Validators::DontCare);
  Group::Group(&this->super_Group,base,&local_40,&local_60,Global);
  std::function<bool_(const_args::Group_&)>::~function(&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__GlobalOptions_003685d8;
  Group::Add(&this->super_Group,local_20);
  return;
}

Assistant:

GlobalOptions(Group &base, Base &options_) : Group(base, {}, Group::Validators::DontCare, Options::Global)
            {
                Add(options_);
            }